

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginInternal.hpp
# Opt level: O0

uint32_t __thiscall DISTRHO::PluginExporter::getVersion(PluginExporter *this)

{
  PluginExporter *this_local;
  
  if (this->fPlugin == (Plugin *)0x0) {
    d_safe_assert("fPlugin != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/dpf/distrho/src/DistrhoPluginInternal.hpp"
                  ,0x1d1);
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = (*this->fPlugin->_vptr_Plugin[8])();
  }
  return this_local._4_4_;
}

Assistant:

uint32_t getVersion() const noexcept
    {
        DISTRHO_SAFE_ASSERT_RETURN(fPlugin != nullptr, 0);

        return fPlugin->getVersion();
    }